

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O0

void * __thiscall
absl::debugging_internal::ElfMemImage::GetSymAddr(ElfMemImage *this,Elf64_Sym *sym)

{
  char *absl_raw_logging_internal_basename;
  Elf64_Sym *sym_local;
  ElfMemImage *this_local;
  
  if ((sym->st_shndx == 0) || (0xfeff < sym->st_shndx)) {
    this_local = (ElfMemImage *)sym->st_value;
  }
  else {
    if (sym->st_value <= this->link_base_) {
      raw_logging_internal::RawLog
                (kFatal,"elf_mem_image.cc",0x7d,"Check %s failed: %s","link_base_ < sym->st_value",
                 "symbol out of range");
    }
    this_local = (ElfMemImage *)
                 anon_unknown_1::GetTableElement<char>
                           (this->ehdr_,0,1,sym->st_value - this->link_base_);
  }
  return this_local;
}

Assistant:

const void *ElfMemImage::GetSymAddr(const ElfW(Sym) *sym) const {
  if (sym->st_shndx == SHN_UNDEF || sym->st_shndx >= SHN_LORESERVE) {
    // Symbol corresponds to "special" (e.g. SHN_ABS) section.
    return reinterpret_cast<const void *>(sym->st_value);
  }
  ABSL_RAW_CHECK(link_base_ < sym->st_value, "symbol out of range");
  return GetTableElement<char>(ehdr_, 0, 1, sym->st_value - link_base_);
}